

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::CleanUpInlineCaches<true>(FunctionBody *this)

{
  InlineCache *pIVar1;
  IsInstInlineCache *this_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar6;
  undefined4 *puVar7;
  FunctionBodyPolymorphicInlineCache *pFVar8;
  ProfileId i;
  ulong uVar9;
  uint i_1;
  ulong uVar10;
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_40;
  Type runtimeData;
  uint unregisteredInlineCacheCount;
  
  runtimeData.ptr._4_4_ = 0;
  if ((this->inlineCaches).ptr != (void **)0x0) {
    uVar4 = GetRootObjectLoadInlineCacheStart(this);
    uVar9 = (ulong)uVar4;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar10];
      if (pIVar1 != (InlineCache *)0x0) {
        InlineCache::Clear(pIVar1);
      }
    }
    GetRootObject(this);
    uVar4 = GetRootObjectLoadMethodInlineCacheStart(this);
    for (; uVar9 < uVar4; uVar9 = uVar9 + 1) {
      pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar9];
      if (pIVar1 != (InlineCache *)0x0) {
        InlineCache::Clear(pIVar1);
      }
    }
    uVar4 = GetRootObjectStoreInlineCacheStart(this);
    for (; uVar9 < uVar4; uVar9 = uVar9 + 1) {
      pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar9];
      if (pIVar1 != (InlineCache *)0x0) {
        InlineCache::Clear(pIVar1);
      }
    }
    uVar4 = GetInlineCacheCount(this);
    for (; uVar9 < uVar4; uVar9 = uVar9 + 1) {
      pIVar1 = (InlineCache *)(this->inlineCaches).ptr[uVar9];
      if (pIVar1 != (InlineCache *)0x0) {
        InlineCache::Clear(pIVar1);
      }
    }
    uVar4 = GetInlineCacheCount(this);
    uVar5 = GetIsInstInlineCacheCount(this);
    for (; uVar9 < uVar5 + uVar4; uVar9 = uVar9 + 1) {
      this_00 = (IsInstInlineCache *)(this->inlineCaches).ptr[uVar9];
      if (this_00 != (IsInstInlineCache *)0x0) {
        IsInstInlineCache::Clear(this_00);
      }
    }
    (this->inlineCaches).ptr = (void **)0x0;
  }
  pWVar6 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)11,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar6 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    for (uVar9 = 0; uVar9 < this->profiledCallSiteCount; uVar9 = uVar9 + 1) {
      if (pWVar6[uVar9].ptr != (FunctionCodeGenRuntimeData *)0x0) {
        fn.this = this;
        fn.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_1_>
                  (pWVar6[uVar9].ptr,fn);
      }
    }
  }
  pWVar6 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)8,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar6 != (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    for (uVar9 = 0; uVar4 = GetInlineCacheCount(this), uVar9 < uVar4; uVar9 = uVar9 + 1) {
      Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr(&local_40,pWVar6);
      if (local_40.ptr != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<true>()::_lambda(Js::InlineCache*)_2_>
                  (local_40.ptr,fn_00);
      }
      pWVar6 = pWVar6 + 1;
    }
  }
  if (runtimeData.ptr._4_4_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1db7,"(!IsScriptContextShutdown)",
                                "Unregistration of inlineCache should only be done if this is not scriptContext shutdown."
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    ThreadContext::NotifyInlineCacheBatchUnregistered
              (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               threadContext,runtimeData.ptr._4_4_);
  }
  while (pFVar8 = FunctionProxy::
                  GetAuxPtr<(Js::FunctionProxy::AuxPointerType)12,Js::FunctionBodyPolymorphicInlineCache*>
                            ((FunctionProxy *)this),
        pFVar8 != (FunctionBodyPolymorphicInlineCache *)0x0) {
    pFVar8 = FunctionProxy::
             GetAuxPtr<(Js::FunctionProxy::AuxPointerType)12,Js::FunctionBodyPolymorphicInlineCache*>
                       ((FunctionProxy *)this);
    FunctionBodyPolymorphicInlineCache::Finalize(pFVar8,true);
  }
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }